

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O2

void __thiscall duckdb::ART::TransformToDeprecated(ART *this)

{
  shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
  *this_00;
  __uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_> __p;
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> __p_00;
  type paVar1;
  unsafe_unique_ptr<FixedSizeAllocator> deprecated_allocator;
  unsigned_long prefix_size;
  __uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
  local_30;
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> local_28;
  unsigned_long local_20;
  
  this_00 = &this->allocators;
  paVar1 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
           ::operator*(this_00);
  local_30._M_t.
  super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
  .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl =
       (tuple<duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>)
       (_Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
        )0x0;
  if (this->prefix_count != '\x0f') {
    local_20 = 0x18;
    make_unsafe_uniq<duckdb::FixedSizeAllocator,unsigned_long&,duckdb::BlockManager&>
              ((duckdb *)&local_28,&local_20,
               *(BlockManager **)
                paVar1->_M_elems[0].
                super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                ._M_t.
                super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
                .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>);
    __p_00._M_head_impl = local_28._M_head_impl;
    local_28._M_head_impl = (pointer)0x0;
    ::std::
    __uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>::
    reset(&local_30,__p_00._M_head_impl);
    ::std::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
    ::~unique_ptr((unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                   *)&local_28);
  }
  if (*(char *)((long)&(this->tree).super_IndexPointer.data + 7) != '\0') {
    Node::TransformToDeprecated(this,&this->tree,(unsafe_unique_ptr<FixedSizeAllocator> *)&local_30)
    ;
  }
  if (local_30._M_t.
      super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
      .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
       )0x0) {
    this->prefix_count = '\x0f';
    paVar1 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
             ::operator*(this_00);
    FixedSizeAllocator::Reset
              ((FixedSizeAllocator *)
               paVar1->_M_elems[0].
               super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
               .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>);
    paVar1 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
             ::operator*(this_00);
    __p._M_t.
    super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
    .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl =
         local_30._M_t.
         super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
         .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
    local_30._M_t.
    super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
    .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl =
         (tuple<duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>)
         (_Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
          )0x0;
    ::std::
    __uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>::
    reset((__uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
           *)paVar1,
          (pointer)__p._M_t.
                   super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
                   .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl);
  }
  ::std::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>::
  ~unique_ptr((unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               *)&local_30);
  return;
}

Assistant:

void ART::TransformToDeprecated() {
	auto idx = Node::GetAllocatorIdx(NType::PREFIX);
	auto &block_manager = (*allocators)[idx]->block_manager;
	unsafe_unique_ptr<FixedSizeAllocator> deprecated_allocator;

	if (prefix_count != Prefix::DEPRECATED_COUNT) {
		auto prefix_size = NumericCast<idx_t>(Prefix::DEPRECATED_COUNT) + NumericCast<idx_t>(Prefix::METADATA_SIZE);
		deprecated_allocator = make_unsafe_uniq<FixedSizeAllocator>(prefix_size, block_manager);
	}

	// Transform all leaves, and possibly the prefixes.
	if (tree.HasMetadata()) {
		Node::TransformToDeprecated(*this, tree, deprecated_allocator);
	}

	// Replace the prefix allocator with the deprecated allocator.
	if (deprecated_allocator) {
		prefix_count = Prefix::DEPRECATED_COUNT;

		D_ASSERT((*allocators)[idx]->Empty());
		(*allocators)[idx]->Reset();
		(*allocators)[idx] = std::move(deprecated_allocator);
	}
}